

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_checkbox_flags_text(nk_context *ctx,char *text,int len,uint *flags,uint value)

{
  nk_bool nVar1;
  uint uVar2;
  nk_bool nVar3;
  nk_bool active;
  
  nVar3 = 0;
  if (flags != (uint *)0x0 && (text != (char *)0x0 && ctx != (nk_context *)0x0)) {
    active = *flags & value;
    nVar1 = nk_checkbox_text(ctx,text,len,&active);
    if (nVar1 != 0) {
      if (active == 0) {
        uVar2 = ~value & *flags;
      }
      else {
        uVar2 = value | *flags;
      }
      *flags = uVar2;
      nVar3 = 1;
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_checkbox_flags_text(struct nk_context *ctx, const char *text, int len,
unsigned int *flags, unsigned int value)
{
nk_bool active;
NK_ASSERT(ctx);
NK_ASSERT(text);
NK_ASSERT(flags);
if (!ctx || !text || !flags) return 0;

active = (int)((*flags & value) & value);
if (nk_checkbox_text(ctx, text, len, &active)) {
if (active) *flags |= value;
else *flags &= ~value;
return 1;
}
return 0;
}